

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_crossing_analysis.cc
# Opt level: O1

bool __thiscall
sptk::ZeroCrossingAnalysis::Run
          (ZeroCrossingAnalysis *this,vector<double,_std::allocator<double>_> *signals,
          int *num_zero_crossing,Buffer *buffer)

{
  int iVar1;
  double *pdVar2;
  bool bVar3;
  uint uVar4;
  long lVar5;
  long lVar6;
  
  if (this->is_valid_ == true) {
    bVar3 = false;
    if ((buffer != (Buffer *)0x0) && (num_zero_crossing != (int *)0x0)) {
      pdVar2 = (signals->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      iVar1 = this->frame_length_;
      lVar5 = (long)iVar1;
      if ((long)(signals->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_finish - (long)pdVar2 >> 3 == lVar5) {
        if (buffer->is_first_frame_ == true) {
          buffer->latest_signal_ = *pdVar2;
          buffer->is_first_frame_ = false;
        }
        uVar4 = -(uint)(0.0 <= buffer->latest_signal_ && *pdVar2 < 0.0 ||
                       0.0 <= *pdVar2 && buffer->latest_signal_ < 0.0) & 1;
        if (1 < iVar1) {
          lVar6 = 1;
          do {
            uVar4 = uVar4 + (0.0 <= pdVar2[lVar6 + -1] && pdVar2[lVar6] < 0.0 ||
                            pdVar2[lVar6 + -1] < 0.0 && 0.0 <= pdVar2[lVar6]);
            lVar6 = lVar6 + 1;
          } while (lVar5 != lVar6);
        }
        buffer->latest_signal_ = pdVar2[lVar5 + -1];
        *num_zero_crossing = uVar4;
        bVar3 = true;
      }
    }
    return bVar3;
  }
  return false;
}

Assistant:

bool ZeroCrossingAnalysis::Run(const std::vector<double>& signals,
                               int* num_zero_crossing,
                               ZeroCrossingAnalysis::Buffer* buffer) const {
  // Check inputs.
  if (!is_valid_ || signals.size() != static_cast<std::size_t>(frame_length_) ||
      NULL == num_zero_crossing || NULL == buffer) {
    return false;
  }

  const double* x(&(signals[0]));

  if (buffer->is_first_frame_) {
    buffer->latest_signal_ = x[0];
    buffer->is_first_frame_ = false;
  }

  int count(0);
  if (IsCrossed(buffer->latest_signal_, x[0])) {
    ++count;
  }
  for (int i(1); i < frame_length_; ++i) {
    if (IsCrossed(x[i - 1], x[i])) {
      ++count;
    }
  }

  buffer->latest_signal_ = x[frame_length_ - 1];
  *num_zero_crossing = count;

  return true;
}